

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O2

void Abc_NtkLutminConstruct(Abc_Ntk_t *pNtkClp,Abc_Ntk_t *pNtkDec,int nLutSize,int fVerbose)

{
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar1;
  long lVar2;
  int i;
  
  p = Abc_NtkDfs(pNtkClp,0);
  for (i = 0; i < p->nSize; i = i + 1) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(p,i);
    if (nLutSize < (pObj->vFanins).nSize) {
      pAVar1 = Abc_NtkBddDecompose(pNtkDec,pObj,nLutSize,fVerbose);
      (pObj->field_6).pCopy = pAVar1;
    }
    else {
      pAVar1 = Abc_NtkDupObj(pNtkDec,pObj,0);
      (pObj->field_6).pCopy = pAVar1;
      for (lVar2 = 0; lVar2 < (pObj->vFanins).nSize; lVar2 = lVar2 + 1) {
        Abc_ObjAddFanin((pObj->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]] + 0x40));
      }
    }
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_NtkLutminConstruct( Abc_Ntk_t * pNtkClp, Abc_Ntk_t * pNtkDec, int nLutSize, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    vNodes = Abc_NtkDfs( pNtkClp, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjFaninNum(pNode) <= nLutSize )
        {
            pNode->pCopy = Abc_NtkDupObj( pNtkDec, pNode, 0 );
            Abc_ObjForEachFanin( pNode, pFanin, k )
                Abc_ObjAddFanin( pNode->pCopy, pFanin->pCopy );
        }
        else
            pNode->pCopy = Abc_NtkBddDecompose( pNtkDec, pNode, nLutSize, fVerbose );
    }
    Vec_PtrFree( vNodes );
}